

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O2

XVisualInfo * get_glx_visual(Display *dpy)

{
  XVisualInfo *pXVar1;
  int attrib [9];
  
  pXVar1 = (XVisualInfo *)(*_epoxy_glXChooseVisual)(dpy,*(undefined4 *)(dpy + 0xe0));
  if (pXVar1 != (XVisualInfo *)0x0) {
    return pXVar1;
  }
  fwrite("Couldn\'t get an RGBA, double-buffered visual\n",0x2d,1,_stderr);
  exit(1);
}

Assistant:

XVisualInfo *
get_glx_visual(Display *dpy)
{
	XVisualInfo *visinfo;
	int attrib[] = {
		GLX_RGBA,
		GLX_RED_SIZE, 1,
		GLX_GREEN_SIZE, 1,
		GLX_BLUE_SIZE, 1,
		GLX_DOUBLEBUFFER,
		None
	};
	int screen = DefaultScreen(dpy);

	visinfo = glXChooseVisual(dpy, screen, attrib);
	if (visinfo == NULL) {
		fprintf(stderr,
			"Couldn't get an RGBA, double-buffered visual\n");
		exit(1);
	}

	return visinfo;
}